

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Holding.cpp
# Opt level: O0

void __thiscall Holding::PrintHolding(Holding *this)

{
  int iVar1;
  ostream *poVar2;
  string *psVar3;
  Holding *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Card: ");
  poVar2 = std::operator<<(poVar2,(string *)&this->name);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Cost: ");
  iVar1 = (*(this->super_BlackCard).super_Card._vptr_Card[4])();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Holding Type: ");
  if (this->typeH == PLAIN) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Plain");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (this->typeH == MINE) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Mine");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (this->typeH == GOLD_MINE) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Gold Mine");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (this->typeH == CRYSTAL_MINE) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Crystal Mine");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (this->typeH == FARMS) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Farms");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    if (this->typeH != SOLO) {
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Gifts and Favour");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if ((this->tapped & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Tapped: no");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Tapped: yes");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if ((this->revealed & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Revealed: no");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Revealed: yes");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Harvest Value: ");
  iVar1 = (*(this->super_BlackCard).super_Card._vptr_Card[7])();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if ((this->upperHolding == (Holding *)0x0) && (this->subHolding == (Holding *)0x0)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Holding is not in a chain");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    if ((this->upperHolding == (Holding *)0x0) || (this->subHolding == (Holding *)0x0)) {
      if (this->upperHolding == (Holding *)0x0) {
        if (this->subHolding->subHolding == (Holding *)0x0) {
          poVar2 = std::operator<<((ostream *)&std::cout,"Holding connected with the subHolding ");
          psVar3 = BlackCard::getName_abi_cxx11_(&this->subHolding->super_BlackCard);
          poVar2 = std::operator<<(poVar2,(string *)psVar3);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,"Holding in complete chain with ");
          psVar3 = BlackCard::getName_abi_cxx11_(&this->subHolding->super_BlackCard);
          poVar2 = std::operator<<(poVar2,(string *)psVar3);
          poVar2 = std::operator<<(poVar2,"and ");
          psVar3 = BlackCard::getName_abi_cxx11_(&this->subHolding->subHolding->super_BlackCard);
          poVar2 = std::operator<<(poVar2,(string *)psVar3);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
      }
      else if (this->upperHolding->upperHolding == (Holding *)0x0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Holding connected with the upperholding ");
        psVar3 = BlackCard::getName_abi_cxx11_(&this->upperHolding->super_BlackCard);
        poVar2 = std::operator<<(poVar2,(string *)psVar3);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Holding in complete chain with ");
        psVar3 = BlackCard::getName_abi_cxx11_(&this->upperHolding->super_BlackCard);
        poVar2 = std::operator<<(poVar2,(string *)psVar3);
        poVar2 = std::operator<<(poVar2,"and ");
        psVar3 = BlackCard::getName_abi_cxx11_(&this->upperHolding->upperHolding->super_BlackCard);
        poVar2 = std::operator<<(poVar2,(string *)psVar3);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Holding in complete chain with ");
      psVar3 = BlackCard::getName_abi_cxx11_(&this->subHolding->super_BlackCard);
      poVar2 = std::operator<<(poVar2,(string *)psVar3);
      poVar2 = std::operator<<(poVar2,"and ");
      psVar3 = BlackCard::getName_abi_cxx11_(&this->upperHolding->super_BlackCard);
      poVar2 = std::operator<<(poVar2,(string *)psVar3);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Holding::PrintHolding()                  //prints holding's card stats
{
    cout << "Card: " << name << endl;
    cout << "Cost: " << getCost() << endl;

    cout << "Holding Type: ";
    if (typeH == PLAIN)
        cout << "Plain" << endl;
    else if (typeH == MINE)
        cout << "Mine" << endl;
    else if (typeH == GOLD_MINE)
        cout << "Gold Mine" << endl;
    else if (typeH == CRYSTAL_MINE)
        cout << "Crystal Mine" << endl;
    else if (typeH == FARMS)
        cout << "Farms" << endl;
    else if (typeH == SOLO)
        cout << "Gifts and Favour" << endl;
    else
        return;

    
    if (tapped)
        cout << "Tapped: yes" << endl;
    else
        cout << "Tapped: no" << endl;

    if (revealed)
        cout << "Revealed: yes" << endl;
    else
        cout << "Revealed: no" << endl;

    cout << "Harvest Value: " << getHarvestValue() << endl;

    if (!upperHolding && !subHolding)
    {
        cout << "Holding is not in a chain" << endl << endl;
        return;
    }
    if (upperHolding && subHolding)
        cout << "Holding in complete chain with "<< subHolding->getName() << "and " << upperHolding->getName() << endl;
    else if (upperHolding)
    {
        if (upperHolding->upperHolding)
            cout << "Holding in complete chain with "<< upperHolding->getName() << "and " << upperHolding->upperHolding->getName() << endl;
        else
            cout << "Holding connected with the upperholding " << upperHolding->getName() << endl;
    }
    else
    {
        if (subHolding->subHolding)
            cout << "Holding in complete chain with "<< subHolding->getName() << "and " << subHolding->subHolding->getName() << endl;
        else
            cout << "Holding connected with the subHolding " << subHolding->getName() << endl;
    }
    cout << endl;
}